

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
CEAngle::HmsVect(vector<double,_std::allocator<double>_> *__return_storage_ptr__,CEAngle *this)

{
  reference pvVar1;
  size_type __n;
  reference pvVar2;
  char pm;
  allocator<double> local_39;
  double local_38;
  vector<int,_std::allocator<int>_> HMS_i;
  
  std::allocator<int>::allocator((allocator<int> *)&pm);
  std::vector<int,_std::allocator<int>_>::vector(&HMS_i,4,(allocator<int> *)&pm);
  __gnu_cxx::new_allocator<int>::~new_allocator((new_allocator<int> *)&pm);
  local_38 = this->angle_;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&HMS_i,0);
  iauA2tf(local_38,9,&pm,pvVar1);
  __n = std::vector<int,_std::allocator<int>_>::size(&HMS_i);
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_39);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_39);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&HMS_i,0);
  local_38 = (double)*pvVar1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar2 = local_38;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&HMS_i,1);
  local_38 = (double)*pvVar1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  *pvVar2 = local_38;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&HMS_i,2);
  local_38 = (double)*pvVar1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  *pvVar2 = local_38;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&HMS_i,3);
  local_38 = (double)*pvVar1 / 1000000000.0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,3);
  *pvVar2 = local_38;
  if (pm == '-') {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
    *pvVar2 = -*pvVar2;
  }
  std::vector<int,_std::allocator<int>_>::~vector(&HMS_i);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> CEAngle::HmsVect(void) const
{
    // Stores the resulting values
    std::vector<int> HMS_i(4);

    // Stores the sign
    char pm;
    iauA2tf(9, angle_, &pm, &HMS_i[0]);
    
    // Convert the values into doubles
    std::vector<double> HMS_d(HMS_i.size());
    // Scale the fraction to be a true fraction
    HMS_d[0] = double(HMS_i[0]);
    HMS_d[1] = double(HMS_i[1]);
    HMS_d[2] = double(HMS_i[2]);
    HMS_d[3] = double(HMS_i[3])/1.0e9;
    // Multiply the degree by a negative
    if (pm == '-') HMS_d[0] *= -1;

    return HMS_d;
}